

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupType::CovergroupType
          (CovergroupType *this,Compilation *compilation,string_view name,SourceLocation loc,
          CovergroupBodySymbol *body)

{
  string_view name_00;
  Type *in_RCX;
  Scope *in_RDX;
  size_t in_RSI;
  Symbol *in_RDI;
  Compilation *in_R8;
  SourceLocation in_R9;
  
  name_00._M_str = (char *)in_RDI;
  name_00._M_len = in_RSI;
  Type::Type(in_RCX,(SymbolKind)((ulong)in_RDX >> 0x20),name_00,in_R9);
  Scope::Scope(in_RDX,in_R8,in_RDI);
  *(SourceLocation *)(in_RDI + 2) = in_R9;
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)0x436e06
            );
  std::optional<const_slang::ast::TimingControl_*>::optional
            ((optional<const_slang::ast::TimingControl_*> *)0x436e17);
  in_RDI[2].nextInScope = (Symbol *)0x0;
  return;
}

Assistant:

CovergroupType::CovergroupType(Compilation& compilation, std::string_view name, SourceLocation loc,
                               const CovergroupBodySymbol& body) :
    Type(SymbolKind::CovergroupType, name, loc), Scope(compilation, this), body(body) {
}